

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O2

int __thiscall
tcu::Float<unsigned_long,_11,_52,_1023,_3U>::exponent(Float<unsigned_long,_11,_52,_1023,_3U> *this)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  
  uVar1 = this->m_value;
  iVar3 = ((uint)(uVar1 >> 0x34) & 0x7ff) - 0x3ff;
  iVar2 = -0x3fe;
  if ((uVar1 & 0xfffffffffffff) == 0) {
    iVar2 = iVar3;
  }
  if ((uVar1 & 0x7ff0000000000000) != 0) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

inline StorageType		exponentBits	(void) const	{ return (m_value >> MantissaBits) & ((StorageType(1)<<ExponentBits)-1);	}